

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeGPRwithAPSRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus In;
  uint64_t in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  MCInst *in_RDI;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  if (in_ESI == 0xf) {
    MCOperand_CreateReg0(in_RDI,2);
    local_4 = MCDisassembler_Success;
  }
  else {
    In = DecodeGPRRegisterClass
                   ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                    (uint)((ulong)in_RDX >> 0x20),in_RCX,
                    (void *)CONCAT44(3,in_stack_ffffffffffffffd0));
    Check((DecodeStatus *)&stack0xffffffffffffffd4,In);
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeGPRwithAPSRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (RegNo == 15) {
		MCOperand_CreateReg0(Inst, ARM_APSR_NZCV);
		return MCDisassembler_Success;
	}

	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));
	return S;
}